

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O2

string * FIX::socket_get_last_error_abi_cxx11_(void)

{
  int __errnum;
  int *piVar1;
  ostream *poVar2;
  char *pcVar3;
  string *in_RDI;
  stringstream errorMessage;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  piVar1 = __errno_location();
  __errnum = *piVar1;
  poVar2 = std::operator<<(local_190,"Winsock error ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,__errnum);
  poVar2 = std::operator<<(poVar2,": ");
  pcVar3 = strerror(__errnum);
  std::operator<<(poVar2,pcVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string socket_get_last_error() {
  std::stringstream errorMessage;
#ifdef _MSC_VER
  int winsockErrorCode = WSAGetLastError();

  char *s = NULL;
  FormatMessageA(
      FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM | FORMAT_MESSAGE_IGNORE_INSERTS,
      NULL,
      winsockErrorCode,
      MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
      (LPSTR)&s,
      0,
      NULL);
  errorMessage << "Winsock error " << winsockErrorCode << ": " << s;
  LocalFree(s);
#else
  int errorNumber = errno;
  errorMessage << "Winsock error " << errorNumber << ": " << strerror(errorNumber);
#endif
  return errorMessage.str();
}